

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmNinjaNormalTargetGenerator::WriteDeviceLinkStatement(cmNinjaNormalTargetGenerator *this)

{
  cmOutputConverter *this_00;
  ulong *puVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  cmGeneratorTarget *target;
  cmMakefile *pcVar4;
  pointer pcVar5;
  cmLocalNinjaGenerator *pcVar6;
  size_type sVar7;
  bool bVar8;
  cmGlobalNinjaGenerator *this_02;
  string *psVar9;
  string *psVar10;
  long *plVar11;
  cmGeneratedFileStream *pcVar12;
  char *pcVar13;
  size_t sVar14;
  ostream *poVar15;
  mapped_type *pmVar16;
  mapped_type *flags;
  mapped_type *linkFlags;
  char *__s;
  size_t sVar17;
  mapped_type *pmVar18;
  ulong *puVar19;
  size_type *psVar20;
  size_type sVar21;
  cmOutputConverter *outputConverter;
  bool usedResponseFile;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  string objPath;
  key_type local_2c8;
  TargetType local_2a4;
  cmNinjaLinkLineDeviceComputer *local_2a0;
  cmLocalNinjaGenerator *local_298;
  cmGlobalNinjaGenerator *local_290;
  key_type local_288;
  string cfgName;
  string frameworkPath;
  string cudaLinkLanguage;
  string targetOutputReal;
  string linkPath;
  undefined1 local_1b8 [232];
  _Alloc_hider local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  long *local_b0 [2];
  long local_a0 [2];
  string createRule;
  string local_70;
  string targetOutputImplib;
  
  this_02 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  puVar1 = (ulong *)(local_1b8 + 0x10);
  local_1b8._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"CUDA","");
  local_290 = this_02;
  bVar8 = cmGlobalGenerator::GetLanguageEnabled((cmGlobalGenerator *)this_02,(string *)local_1b8);
  if ((ulong *)local_1b8._0_8_ != puVar1) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
  }
  if (bVar8) {
    target = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    bVar8 = requireDeviceLinking
                      (target,(cmLocalGenerator *)
                              (this->super_cmNinjaTargetGenerator).LocalGenerator,
                       &(this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                        ConfigName);
    if (bVar8) {
      cudaLinkLanguage._M_dataplus._M_p = (pointer)&cudaLinkLanguage.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&cudaLinkLanguage,"CUDA","");
      pcVar4 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
      local_1b8._0_8_ = puVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,"CMAKE_CUDA_OUTPUT_EXTENSION","");
      psVar9 = cmMakefile::GetSafeDefinition(pcVar4,(string *)local_1b8);
      if ((ulong *)local_1b8._0_8_ != puVar1) {
        operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
      }
      psVar10 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
      cfgName._M_dataplus._M_p = (pointer)&cfgName.field_2;
      pcVar5 = (psVar10->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&cfgName,pcVar5,pcVar5 + psVar10->_M_string_length);
      objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
      pcVar5 = (target->ObjectDirectory)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&objPath,pcVar5,pcVar5 + (target->ObjectDirectory)._M_string_length);
      std::__cxx11::string::append((char *)&objPath);
      plVar11 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&objPath,(ulong)(psVar9->_M_dataplus)._M_p);
      puVar19 = (ulong *)(plVar11 + 2);
      if ((ulong *)*plVar11 == puVar19) {
        local_1b8._16_8_ = *puVar19;
        local_1b8._24_8_ = plVar11[3];
        local_1b8._0_8_ = puVar1;
      }
      else {
        local_1b8._16_8_ = *puVar19;
        local_1b8._0_8_ = (ulong *)*plVar11;
      }
      local_1b8._8_8_ = plVar11[1];
      *plVar11 = (long)puVar19;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      cmNinjaTargetGenerator::ConvertToNinjaPath
                (&targetOutputReal,&this->super_cmNinjaTargetGenerator,(string *)local_1b8);
      if ((ulong *)local_1b8._0_8_ != puVar1) {
        operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)objPath._M_dataplus._M_p != &objPath.field_2) {
        operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
      }
      cmGeneratorTarget::GetFullPath
                ((string *)local_1b8,target,&cfgName,ImportLibraryArtifact,false);
      cmNinjaTargetGenerator::ConvertToNinjaPath
                (&targetOutputImplib,&this->super_cmNinjaTargetGenerator,(string *)local_1b8);
      if ((ulong *)local_1b8._0_8_ != puVar1) {
        operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
      }
      std::__cxx11::string::_M_assign((string *)&this->DeviceLinkObject);
      pcVar12 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::WriteDivider((ostream *)pcVar12);
      local_2a4 = cmGeneratorTarget::GetType(target);
      pcVar12 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pcVar12,"# Device Link build statements for ",0x23);
      pcVar13 = cmState::GetTargetTypeName(local_2a4);
      if (pcVar13 == (char *)0x0) {
        std::ios::clear((int)pcVar12 +
                        (int)(pcVar12->super_ofstream).
                             super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                             [-3]);
      }
      else {
        sVar14 = strlen(pcVar13);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar12,pcVar13,sVar14);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar12," target ",8);
      cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
                ((string *)local_1b8,&this->super_cmNinjaTargetGenerator);
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pcVar12,(char *)local_1b8._0_8_,local_1b8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n\n",2);
      if ((ulong *)local_1b8._0_8_ != puVar1) {
        operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
      }
      LanguageLinkerDeviceRule_abi_cxx11_(&local_70,this);
      local_1b8._32_8_ = local_1b8 + 0x30;
      local_1b8._8_8_ = 0;
      local_1b8._16_8_ = local_1b8._16_8_ & 0xffffffffffffff00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) {
        local_1b8._56_8_ = local_70.field_2._8_8_;
      }
      else {
        local_1b8._32_8_ = local_70._M_dataplus._M_p;
      }
      local_1b8._208_8_ = local_1b8 + 0xc0;
      local_1b8._40_8_ = local_70._M_string_length;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      local_1b8._192_4_ = _S_red;
      local_1b8._200_8_ = (_Base_ptr)0x0;
      local_1b8._64_8_ = (pointer)0x0;
      local_1b8._72_8_ = (pointer)0x0;
      local_1b8._80_8_ = (pointer)0x0;
      local_1b8._88_8_ = (pointer)0x0;
      local_1b8._96_8_ = (pointer)0x0;
      local_1b8._104_8_ = (pointer)0x0;
      local_1b8._112_8_ = (pointer)0x0;
      local_1b8._120_8_ = (pointer)0x0;
      local_1b8._128_8_ = (pointer)0x0;
      local_1b8._136_8_ = (pointer)0x0;
      local_1b8._144_8_ = (pointer)0x0;
      local_1b8._152_8_ = (pointer)0x0;
      local_1b8._160_8_ = (pointer)0x0;
      local_1b8._168_8_ = (pointer)0x0;
      local_1b8._176_8_ = (pointer)0x0;
      local_1b8._224_8_ = 0;
      local_d0._M_p = (pointer)&local_c0;
      local_c8 = 0;
      local_c0._M_local_buf[0] = '\0';
      local_1b8._0_8_ = puVar1;
      local_1b8._216_8_ = local_1b8._208_8_;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_replace((ulong)local_1b8,0,(char *)0x0,0x559dca);
      GetVisibleTypeName(this);
      std::__cxx11::string::append(local_1b8);
      std::__cxx11::string::append(local_1b8);
      std::__cxx11::string::_M_append(local_1b8,(ulong)targetOutputReal._M_dataplus._M_p);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b8 + 0x40),&targetOutputReal);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&frameworkPath,&(this->super_cmNinjaTargetGenerator).Objects);
      objPath.field_2._M_allocated_capacity = local_1b8._128_8_;
      objPath._M_string_length = local_1b8._120_8_;
      objPath._M_dataplus._M_p = (pointer)local_1b8._112_8_;
      local_1b8._128_8_ = frameworkPath.field_2._M_allocated_capacity;
      local_1b8._112_8_ = frameworkPath._M_dataplus._M_p;
      local_1b8._120_8_ = frameworkPath._M_string_length;
      frameworkPath._M_dataplus._M_p = (pointer)0x0;
      frameworkPath._M_string_length = 0;
      frameworkPath.field_2._M_allocated_capacity = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&objPath);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&frameworkPath);
      psVar9 = &this->TargetLinkLanguage;
      cmNinjaTargetGenerator::ComputeLinkDeps
                ((cmNinjaDeps *)&frameworkPath,&this->super_cmNinjaTargetGenerator,psVar9);
      objPath.field_2._M_allocated_capacity = local_1b8._152_8_;
      objPath._M_string_length = local_1b8._144_8_;
      objPath._M_dataplus._M_p = (pointer)local_1b8._136_8_;
      local_1b8._152_8_ = frameworkPath.field_2._M_allocated_capacity;
      local_1b8._136_8_ = frameworkPath._M_dataplus._M_p;
      local_1b8._144_8_ = frameworkPath._M_string_length;
      frameworkPath._M_dataplus._M_p = (pointer)0x0;
      frameworkPath._M_string_length = 0;
      frameworkPath.field_2._M_allocated_capacity = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&objPath);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&frameworkPath);
      frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
      frameworkPath._M_string_length = 0;
      frameworkPath.field_2._M_allocated_capacity =
           frameworkPath.field_2._M_allocated_capacity & 0xffffffffffffff00;
      linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
      linkPath._M_string_length = 0;
      linkPath.field_2._M_local_buf[0] = '\0';
      psVar10 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
      cmGeneratorTarget::GetCreateRuleVariable(&createRule,target,psVar9,psVar10);
      pcVar4 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
      objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&objPath,createRule._M_dataplus._M_p,
                 createRule._M_dataplus._M_p + createRule._M_string_length);
      std::__cxx11::string::append((char *)&objPath);
      bVar8 = cmMakefile::IsOn(pcVar4,&objPath);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)objPath._M_dataplus._M_p != &objPath.field_2) {
        operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
      }
      local_298 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
      this_00 = &(local_298->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                 super_cmOutputConverter;
      cmOutputConverter::ConvertToOutputFormat(&objPath,this_00,&targetOutputReal,SHELL);
      _usedResponseFile = (pointer)&local_308;
      std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"TARGET_FILE","");
      this_01 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(local_1b8 + 0xb8);
      pmVar16 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](this_01,(key_type *)&usedResponseFile);
      std::__cxx11::string::operator=((string *)pmVar16,(string *)&objPath);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_usedResponseFile != &local_308) {
        operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)objPath._M_dataplus._M_p != &objPath.field_2) {
        operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
      }
      local_2a0 = (cmNinjaLinkLineDeviceComputer *)operator_new(0x48);
      pcVar6 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
      outputConverter =
           &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
      if (pcVar6 == (cmLocalNinjaGenerator *)0x0) {
        outputConverter = (cmOutputConverter *)0x0;
      }
      cmLocalGenerator::GetStateSnapshot
                ((cmStateSnapshot *)&usedResponseFile,(cmLocalGenerator *)pcVar6);
      cmStateSnapshot::GetDirectory
                ((cmStateDirectory *)&objPath,(cmStateSnapshot *)&usedResponseFile);
      cmNinjaLinkLineDeviceComputer::cmNinjaLinkLineDeviceComputer
                (local_2a0,outputConverter,(cmStateDirectory *)&objPath,local_290);
      cmLinkLineComputer::SetUseWatcomQuote((cmLinkLineComputer *)local_2a0,bVar8);
      psVar10 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
      objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"LINK_LIBRARIES","");
      pmVar16 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](this_01,&objPath);
      _usedResponseFile = (pointer)&local_308;
      std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"FLAGS","");
      flags = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](this_01,(key_type *)&usedResponseFile);
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"LINK_FLAGS","");
      linkFlags = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_01,&local_2c8);
      cmLocalGenerator::GetTargetFlags
                ((cmLocalGenerator *)local_298,(cmLinkLineComputer *)local_2a0,psVar10,pmVar16,flags
                 ,linkFlags,&frameworkPath,&linkPath,target);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_usedResponseFile != &local_308) {
        operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)objPath._M_dataplus._M_p != &objPath.field_2) {
        operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
      }
      objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"JOB_POOL_LINK","");
      cmNinjaTargetGenerator::addPoolNinjaVariable
                (&this->super_cmNinjaTargetGenerator,&objPath,target,this_01);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)objPath._M_dataplus._M_p != &objPath.field_2) {
        operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
      }
      _usedResponseFile = (pointer)&local_308;
      std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"LINK_FLAGS","");
      pmVar16 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](this_01,(key_type *)&usedResponseFile);
      cmGlobalNinjaGenerator::EncodeLiteral(&objPath,pmVar16);
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"LINK_FLAGS","");
      pmVar16 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](this_01,&local_2c8);
      std::__cxx11::string::operator=((string *)pmVar16,(string *)&objPath);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)objPath._M_dataplus._M_p != &objPath.field_2) {
        operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_usedResponseFile != &local_308) {
        operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
      }
      cmCommonTargetGenerator::GetManifests_abi_cxx11_(&objPath,(cmCommonTargetGenerator *)this);
      _usedResponseFile = (pointer)&local_308;
      std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"MANIFESTS","");
      pmVar16 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](this_01,(key_type *)&usedResponseFile);
      std::__cxx11::string::operator=((string *)pmVar16,(string *)&objPath);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_usedResponseFile != &local_308) {
        operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)objPath._M_dataplus._M_p != &objPath.field_2) {
        operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&objPath,&frameworkPath,&linkPath);
      _usedResponseFile = (pointer)&local_308;
      std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"LINK_PATH","");
      pmVar16 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](this_01,(key_type *)&usedResponseFile);
      std::__cxx11::string::operator=((string *)pmVar16,(string *)&objPath);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_usedResponseFile != &local_308) {
        operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)objPath._M_dataplus._M_p != &objPath.field_2) {
        operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
      }
      if (local_2a4 == EXECUTABLE) {
        _usedResponseFile = (pointer)&local_308;
        std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"FLAGS","");
        pmVar16 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_01,(key_type *)&usedResponseFile);
        objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
        pcVar5 = (pmVar16->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&objPath,pcVar5,pcVar5 + pmVar16->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_usedResponseFile != &local_308) {
          operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
        }
        cmLocalGenerator::AddArchitectureFlags
                  ((cmLocalGenerator *)local_298,&objPath,target,&cudaLinkLanguage,&cfgName);
        _usedResponseFile = (pointer)&local_308;
        std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"FLAGS","");
        pmVar16 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_01,(key_type *)&usedResponseFile);
        std::__cxx11::string::_M_assign((string *)pmVar16);
      }
      else {
        _usedResponseFile = (pointer)&local_308;
        std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"ARCH_FLAGS","")
        ;
        pmVar16 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_01,(key_type *)&usedResponseFile);
        objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
        pcVar5 = (pmVar16->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&objPath,pcVar5,pcVar5 + pmVar16->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_usedResponseFile != &local_308) {
          operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
        }
        cmLocalGenerator::AddArchitectureFlags
                  ((cmLocalGenerator *)local_298,&objPath,target,&cudaLinkLanguage,&cfgName);
        _usedResponseFile = (pointer)&local_308;
        std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"ARCH_FLAGS","")
        ;
        pmVar16 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_01,(key_type *)&usedResponseFile);
        std::__cxx11::string::_M_assign((string *)pmVar16);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_usedResponseFile != &local_308) {
          operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
        }
        objPath._M_string_length = 0;
        *objPath._M_dataplus._M_p = '\0';
        cmLocalGenerator::AddLanguageFlagsForLinking
                  ((cmLocalGenerator *)local_298,&objPath,target,&cudaLinkLanguage,&cfgName);
        _usedResponseFile = (pointer)&local_308;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&usedResponseFile,"LANGUAGE_COMPILE_FLAGS","");
        pmVar16 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_01,(key_type *)&usedResponseFile);
        std::__cxx11::string::_M_assign((string *)pmVar16);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_usedResponseFile != &local_308) {
        operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)objPath._M_dataplus._M_p != &objPath.field_2) {
        operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
      }
      bVar8 = cmGeneratorTarget::HasSOName(target,&cfgName);
      if (bVar8) {
        __s = cmMakefile::GetSONameFlag
                        ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile
                         ,psVar9);
        objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"SONAME_FLAG","");
        pmVar16 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_01,&objPath);
        pcVar13 = (char *)pmVar16->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)pmVar16,0,pcVar13,(ulong)__s);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)objPath._M_dataplus._M_p != &objPath.field_2) {
          operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
        }
        objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"SONAME","");
        pmVar16 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_01,&objPath);
        std::__cxx11::string::_M_assign((string *)pmVar16);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)objPath._M_dataplus._M_p != &objPath.field_2) {
          operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
        }
        if (local_2a4 == SHARED_LIBRARY) {
          cmGeneratorTarget::GetInstallNameDirForBuildTree
                    (&objPath,(this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                              GeneratorTarget,&cfgName);
          if (objPath._M_string_length != 0) {
            cmOutputConverter::ConvertToOutputFormat
                      ((string *)&usedResponseFile,this_00,&objPath,SHELL);
            local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2c8,"INSTALLNAME_DIR","");
            pmVar16 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](this_01,&local_2c8);
            std::__cxx11::string::operator=((string *)pmVar16,(string *)&usedResponseFile);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
              operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_usedResponseFile != &local_308) {
              operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)objPath._M_dataplus._M_p != &objPath.field_2) {
            operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if ((this->TargetNames).ImportLibrary._M_string_length != 0) {
        cmOutputConverter::ConvertToOutputFormat(&objPath,this_00,&targetOutputImplib,SHELL);
        _usedResponseFile = (pointer)&local_308;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&usedResponseFile,"TARGET_IMPLIB","");
        pmVar16 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_01,(key_type *)&usedResponseFile);
        std::__cxx11::string::_M_assign((string *)pmVar16);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_usedResponseFile != &local_308) {
          operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
        }
        cmNinjaTargetGenerator::EnsureParentDirectoryExists
                  (&this->super_cmNinjaTargetGenerator,&objPath);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)objPath._M_dataplus._M_p != &objPath.field_2) {
          operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
        }
      }
      cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
                (&objPath,(this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                          GeneratorTarget);
      pcVar6 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
      cmNinjaTargetGenerator::ConvertToNinjaPath
                (&local_2c8,&this->super_cmNinjaTargetGenerator,&objPath);
      cmOutputConverter::ConvertToOutputFormat
                ((string *)&usedResponseFile,
                 &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,&local_2c8,SHELL);
      paVar2 = &local_288.field_2;
      local_288._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"OBJECT_DIR","");
      pmVar16 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](this_01,&local_288);
      std::__cxx11::string::operator=((string *)pmVar16,(string *)&usedResponseFile);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != paVar2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_usedResponseFile != &local_308) {
        operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      cmNinjaTargetGenerator::EnsureDirectoryExists(&this->super_cmNinjaTargetGenerator,&objPath);
      cmNinjaTargetGenerator::SetMsvcTargetPdbVariable(&this->super_cmNinjaTargetGenerator,this_01);
      if (local_290->UsingGCCOnWindows == true) {
        _usedResponseFile = (pointer)&local_308;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&usedResponseFile,"LINK_LIBRARIES","");
        pmVar16 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_01,(key_type *)&usedResponseFile);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_usedResponseFile != &local_308) {
          operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
        }
        sVar7 = pmVar16->_M_string_length;
        if (sVar7 != 0) {
          pcVar5 = (pmVar16->_M_dataplus)._M_p;
          sVar21 = 0;
          do {
            if (pcVar5[sVar21] == '\\') {
              pcVar5[sVar21] = '/';
            }
            sVar21 = sVar21 + 1;
          } while (sVar7 != sVar21);
        }
        _usedResponseFile = (pointer)&local_308;
        std::__cxx11::string::_M_construct<char_const*>((string *)&usedResponseFile,"LINK_PATH","");
        pmVar16 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_01,(key_type *)&usedResponseFile);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_usedResponseFile != &local_308) {
          operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
        }
        sVar7 = pmVar16->_M_string_length;
        if (sVar7 != 0) {
          pcVar5 = (pmVar16->_M_dataplus)._M_p;
          sVar21 = 0;
          do {
            if (pcVar5[sVar21] == '\\') {
              pcVar5[sVar21] = '/';
            }
            sVar21 = sVar21 + 1;
          } while (sVar7 != sVar21);
        }
      }
      sVar17 = cmSystemTools::CalculateCommandLineLengthLimit();
      LanguageLinkerDeviceRule_abi_cxx11_((string *)&usedResponseFile,this);
      pmVar18 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&local_290->RuleCmdLength,(key_type *)&usedResponseFile);
      iVar3 = *pmVar18;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_usedResponseFile != &local_308) {
        operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
      }
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"CMakeFiles/","");
      psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(target);
      plVar11 = (long *)std::__cxx11::string::_M_append
                                  ((char *)local_b0,(ulong)(psVar9->_M_dataplus)._M_p);
      psVar20 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar20) {
        local_288.field_2._M_allocated_capacity = *psVar20;
        local_288.field_2._8_8_ = plVar11[3];
        local_288._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_288.field_2._M_allocated_capacity = *psVar20;
        local_288._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_288._M_string_length = plVar11[1];
      *plVar11 = (long)psVar20;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_288);
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
      psVar20 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar20) {
        local_2c8.field_2._M_allocated_capacity = *psVar20;
        local_2c8.field_2._8_8_ = plVar11[3];
      }
      else {
        local_2c8.field_2._M_allocated_capacity = *psVar20;
        local_2c8._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_2c8._M_string_length = plVar11[1];
      *plVar11 = (long)psVar20;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      cmNinjaTargetGenerator::ConvertToNinjaPath
                ((string *)&usedResponseFile,&this->super_cmNinjaTargetGenerator,&local_2c8);
      std::__cxx11::string::operator=((string *)&local_d0,(string *)&usedResponseFile);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_usedResponseFile != &local_308) {
        operator_delete(_usedResponseFile,local_308._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != paVar2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0],local_a0[0] + 1);
      }
      cmLocalNinjaGenerator::AppendTargetDepends
                ((this->super_cmNinjaTargetGenerator).LocalGenerator,
                 (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
                 (cmNinjaDeps *)(local_1b8 + 0xa0),DependOnTargetArtifact);
      _usedResponseFile = _usedResponseFile & 0xffffffffffffff00;
      pcVar12 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::WriteBuild
                (local_290,(ostream *)pcVar12,(cmNinjaBuild *)local_1b8,(int)sVar17 - iVar3,
                 &usedResponseFile);
      WriteDeviceLinkRule(this,usedResponseFile);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)objPath._M_dataplus._M_p != &objPath.field_2) {
        operator_delete(objPath._M_dataplus._M_p,objPath.field_2._M_allocated_capacity + 1);
      }
      (*(local_2a0->super_cmLinkLineDeviceComputer).super_cmLinkLineComputer.
        _vptr_cmLinkLineComputer[1])();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)createRule._M_dataplus._M_p != &createRule.field_2) {
        operator_delete(createRule._M_dataplus._M_p,createRule.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkPath._M_dataplus._M_p != &linkPath.field_2) {
        operator_delete(linkPath._M_dataplus._M_p,
                        CONCAT71(linkPath.field_2._M_allocated_capacity._1_7_,
                                 linkPath.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)frameworkPath._M_dataplus._M_p != &frameworkPath.field_2) {
        operator_delete(frameworkPath._M_dataplus._M_p,
                        frameworkPath.field_2._M_allocated_capacity + 1);
      }
      cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetOutputImplib._M_dataplus._M_p != &targetOutputImplib.field_2) {
        operator_delete(targetOutputImplib._M_dataplus._M_p,
                        targetOutputImplib.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetOutputReal._M_dataplus._M_p != &targetOutputReal.field_2) {
        operator_delete(targetOutputReal._M_dataplus._M_p,
                        targetOutputReal.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cfgName._M_dataplus._M_p != &cfgName.field_2) {
        operator_delete(cfgName._M_dataplus._M_p,cfgName.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cudaLinkLanguage._M_dataplus._M_p != &cudaLinkLanguage.field_2) {
        operator_delete(cudaLinkLanguage._M_dataplus._M_p,
                        cudaLinkLanguage.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteDeviceLinkStatement()
{
  cmGlobalNinjaGenerator* globalGen = this->GetGlobalGenerator();
  if (!globalGen->GetLanguageEnabled("CUDA")) {
    return;
  }

  cmGeneratorTarget* genTarget = this->GetGeneratorTarget();

  bool requiresDeviceLinking = requireDeviceLinking(
    *this->GeneratorTarget, *this->GetLocalGenerator(), this->ConfigName);
  if (!requiresDeviceLinking) {
    return;
  }

  // Now we can do device linking

  // First and very important step is to make sure while inside this
  // step our link language is set to CUDA
  std::string cudaLinkLanguage = "CUDA";
  std::string const& objExt =
    this->Makefile->GetSafeDefinition("CMAKE_CUDA_OUTPUT_EXTENSION");

  std::string const cfgName = this->GetConfigName();
  std::string const targetOutputReal = ConvertToNinjaPath(
    genTarget->ObjectDirectory + "cmake_device_link" + objExt);

  std::string const targetOutputImplib = ConvertToNinjaPath(
    genTarget->GetFullPath(cfgName, cmStateEnums::ImportLibraryArtifact));

  this->DeviceLinkObject = targetOutputReal;

  // Write comments.
  cmGlobalNinjaGenerator::WriteDivider(this->GetBuildFileStream());
  const cmStateEnums::TargetType targetType = genTarget->GetType();
  this->GetBuildFileStream() << "# Device Link build statements for "
                             << cmState::GetTargetTypeName(targetType)
                             << " target " << this->GetTargetName() << "\n\n";

  // Compute the comment.
  cmNinjaBuild build(this->LanguageLinkerDeviceRule());
  build.Comment = "Link the ";
  build.Comment += this->GetVisibleTypeName();
  build.Comment += " ";
  build.Comment += targetOutputReal;

  cmNinjaVars& vars = build.Variables;

  // Compute outputs.
  build.Outputs.push_back(targetOutputReal);
  // Compute specific libraries to link with.
  build.ExplicitDeps = this->GetObjects();
  build.ImplicitDeps = this->ComputeLinkDeps(this->TargetLinkLanguage);

  std::string frameworkPath;
  std::string linkPath;

  std::string createRule = genTarget->GetCreateRuleVariable(
    this->TargetLinkLanguage, this->GetConfigName());
  const bool useWatcomQuote =
    this->GetMakefile()->IsOn(createRule + "_USE_WATCOM_QUOTE");
  cmLocalNinjaGenerator& localGen = *this->GetLocalGenerator();

  vars["TARGET_FILE"] =
    localGen.ConvertToOutputFormat(targetOutputReal, cmOutputConverter::SHELL);

  std::unique_ptr<cmLinkLineComputer> linkLineComputer(
    new cmNinjaLinkLineDeviceComputer(
      this->GetLocalGenerator(),
      this->GetLocalGenerator()->GetStateSnapshot().GetDirectory(),
      globalGen));
  linkLineComputer->SetUseWatcomQuote(useWatcomQuote);

  localGen.GetTargetFlags(
    linkLineComputer.get(), this->GetConfigName(), vars["LINK_LIBRARIES"],
    vars["FLAGS"], vars["LINK_FLAGS"], frameworkPath, linkPath, genTarget);

  this->addPoolNinjaVariable("JOB_POOL_LINK", genTarget, vars);

  vars["LINK_FLAGS"] =
    cmGlobalNinjaGenerator::EncodeLiteral(vars["LINK_FLAGS"]);

  vars["MANIFESTS"] = this->GetManifests();

  vars["LINK_PATH"] = frameworkPath + linkPath;

  // Compute architecture specific link flags.  Yes, these go into a different
  // variable for executables, probably due to a mistake made when duplicating
  // code between the Makefile executable and library generators.
  if (targetType == cmStateEnums::EXECUTABLE) {
    std::string t = vars["FLAGS"];
    localGen.AddArchitectureFlags(t, genTarget, cudaLinkLanguage, cfgName);
    vars["FLAGS"] = t;
  } else {
    std::string t = vars["ARCH_FLAGS"];
    localGen.AddArchitectureFlags(t, genTarget, cudaLinkLanguage, cfgName);
    vars["ARCH_FLAGS"] = t;
    t.clear();
    localGen.AddLanguageFlagsForLinking(t, genTarget, cudaLinkLanguage,
                                        cfgName);
    vars["LANGUAGE_COMPILE_FLAGS"] = t;
  }
  if (genTarget->HasSOName(cfgName)) {
    vars["SONAME_FLAG"] =
      this->GetMakefile()->GetSONameFlag(this->TargetLinkLanguage);
    vars["SONAME"] = this->TargetNames.SharedObject;
    if (targetType == cmStateEnums::SHARED_LIBRARY) {
      std::string install_dir =
        this->GetGeneratorTarget()->GetInstallNameDirForBuildTree(cfgName);
      if (!install_dir.empty()) {
        vars["INSTALLNAME_DIR"] = localGen.ConvertToOutputFormat(
          install_dir, cmOutputConverter::SHELL);
      }
    }
  }

  if (!this->TargetNames.ImportLibrary.empty()) {
    const std::string impLibPath = localGen.ConvertToOutputFormat(
      targetOutputImplib, cmOutputConverter::SHELL);
    vars["TARGET_IMPLIB"] = impLibPath;
    EnsureParentDirectoryExists(impLibPath);
  }

  const std::string objPath = GetGeneratorTarget()->GetSupportDirectory();
  vars["OBJECT_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    this->ConvertToNinjaPath(objPath), cmOutputConverter::SHELL);
  EnsureDirectoryExists(objPath);

  this->SetMsvcTargetPdbVariable(vars);

  if (globalGen->IsGCCOnWindows()) {
    // ar.exe can't handle backslashes in rsp files (implicitly used by gcc)
    std::string& linkLibraries = vars["LINK_LIBRARIES"];
    std::replace(linkLibraries.begin(), linkLibraries.end(), '\\', '/');
    std::string& link_path = vars["LINK_PATH"];
    std::replace(link_path.begin(), link_path.end(), '\\', '/');
  }

  // Device linking currently doesn't support response files so
  // do not check if the user has explicitly forced a response file.
  int const commandLineLengthLimit =
    static_cast<int>(cmSystemTools::CalculateCommandLineLengthLimit()) -
    globalGen->GetRuleCmdLength(this->LanguageLinkerDeviceRule());

  build.RspFile = this->ConvertToNinjaPath(std::string("CMakeFiles/") +
                                           genTarget->GetName() + ".rsp");

  // Gather order-only dependencies.
  this->GetLocalGenerator()->AppendTargetDepends(this->GetGeneratorTarget(),
                                                 build.OrderOnlyDeps);

  // Write the build statement for this target.
  bool usedResponseFile = false;
  globalGen->WriteBuild(this->GetBuildFileStream(), build,
                        commandLineLengthLimit, &usedResponseFile);
  this->WriteDeviceLinkRule(usedResponseFile);
}